

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::predict_or_learn<false>(csoaa *c,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  polyprediction *ppVar5;
  float *pfVar6;
  bool bVar7;
  wclass *pwVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  feature_index i;
  features *pfVar14;
  uint uVar15;
  wclass *__begin3;
  wclass *pwVar16;
  unsigned_long uVar17;
  float fVar18;
  ulong local_68;
  float local_60;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  pwVar8 = (ec->l).cs.costs.end_array;
  sVar9 = (ec->l).cs.costs.erase_count;
  pfVar14 = ec->passthrough;
  if (pfVar14 == (features *)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (long)(pfVar14->values)._end - (long)(pfVar14->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  if (pwVar4 == pwVar3) {
    (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    uVar15 = c->num_classes;
    uVar11 = (ulong)uVar15;
    ppVar5 = c->pred;
    if (*(code **)(base + 0x40) == (code *)0x0) {
      if (uVar11 != 0) {
        lVar12 = 0;
        do {
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          *(float *)((long)ppVar5 + lVar12) = ec->partial_prediction;
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
          lVar12 = lVar12 + 0x20;
        } while (uVar11 << 5 != lVar12);
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar15 * *(int *)(base + 0xe0));
    }
    else {
      (**(code **)(base + 0x40))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar11,
                 *(undefined8 *)(base + 0xe0),ppVar5,0);
    }
    if (c->num_classes == 0) {
      local_68._0_4_ = 1;
    }
    else {
      uVar15 = 1;
      local_68._0_4_ = 1;
      do {
        if (ec->passthrough != (features *)0x0) {
          features::push_back(ec->passthrough,c->pred[uVar15 - 1].scalar,
                              (ulong)uVar15 ^ 0x398d9fda640553);
        }
        fVar18 = c->pred[(uint32_t)local_68 - 1].scalar;
        ppVar5 = c->pred + (uVar15 - 1);
        uVar10 = uVar15;
        if (fVar18 < ppVar5->scalar || fVar18 == ppVar5->scalar) {
          uVar10 = (uint32_t)local_68;
        }
        local_68._0_4_ = uVar10;
        uVar15 = uVar15 + 1;
      } while (uVar15 <= c->num_classes);
    }
    local_60 = c->pred[(uint32_t)local_68 - 1].scalar;
  }
  else {
    local_68 = 1;
    local_60 = 3.4028235e+38;
    pwVar16 = pwVar3;
    do {
      uVar15 = pwVar16->class_index;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar15 - 1));
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)((uVar15 - 1) * *(int *)(base + 0xe0));
      pwVar16->partial_prediction = ec->partial_prediction;
      fVar18 = ec->partial_prediction;
      if (fVar18 < local_60) {
LAB_00243ff6:
        local_68 = (ulong)uVar15;
        local_60 = fVar18;
      }
      else if (((fVar18 == local_60) && (!NAN(fVar18) && !NAN(local_60))) &&
              (bVar7 = uVar15 < (uint32_t)local_68, bVar7)) goto LAB_00243ff6;
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,fVar18,(ulong)uVar15 ^ 0x398d9fda640553);
      }
      pwVar16 = pwVar16 + 1;
    } while (pwVar16 != pwVar4);
  }
  ec->partial_prediction = local_60;
  pfVar14 = ec->passthrough;
  if (pfVar14 != (features *)0x0) {
    pfVar6 = (pfVar14->values)._begin;
    lVar12 = (long)(pfVar14->values)._end - (long)pfVar6 >> 2;
    if (lVar12 == lVar13) {
      i = 0x398d9fdb078fea;
      fVar18 = 3.4028235e+38;
    }
    else {
      fVar18 = 3.4028235e+38;
      uVar17 = 0;
      do {
        fVar2 = pfVar6[lVar13];
        if ((ec->partial_prediction < fVar2) && (fVar2 < fVar18)) {
          uVar17 = (pfVar14->indicies)._begin[lVar13];
          fVar18 = fVar2;
        }
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
      i = uVar17 + 0x1638ab9 ^ 0x398d9fda640553;
    }
    if (3.4028235e+38 <= fVar18) {
      i = 0x398d9fd8715547;
    }
    else {
      features::push_back(pfVar14,fVar18 - ec->partial_prediction,0x398d9fdb078feb);
      pfVar14 = ec->passthrough;
      if (pfVar14 == (features *)0x0) goto LAB_0024427c;
    }
    features::push_back(pfVar14,1.0,i);
  }
LAB_0024427c:
  (ec->pred).multiclass = (uint32_t)local_68;
  (ec->l).cs.costs._begin = pwVar3;
  (ec->l).cs.costs._end = pwVar4;
  (ec->l).cs.costs.end_array = pwVar8;
  (ec->l).cs.costs.erase_count = sVar9;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}